

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMPrint.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  int iVar5;
  XercesDOMParser *this;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  undefined8 uVar11;
  long *plVar12;
  long lVar13;
  ostream *poVar14;
  XMLSize_t i;
  long lVar15;
  char *pcVar16;
  undefined8 *puVar17;
  bool bVar18;
  char *pcVar19;
  ulong uVar20;
  ulong uVar21;
  LocalFileFormatTarget *local_1060;
  DOMPrintFilter *local_1058;
  XMLCh tempStr [3];
  XMLCh *xpathStr;
  
  pcVar16 = (char *)0x0;
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (1 < argC) {
    for (uVar20 = 1;
        (uVar21 = (ulong)(uint)argC, (uint)argC != uVar20 &&
        (pcVar19 = argV[uVar20], uVar21 = uVar20, *pcVar19 == '-')); uVar20 = uVar20 + 1) {
      if ((pcVar19[1] == '?') && (pcVar19[2] == '\0')) {
        usage();
        goto LAB_00103e24;
      }
      if (((pcVar19[1] == 'v') && (pcVar19[2] == '=')) ||
         ((pcVar19[1] == 'V' && (pcVar19[2] == '=')))) {
        pcVar19 = pcVar19 + 3;
        pcVar16 = "never";
        iVar5 = strcmp(pcVar19,"never");
        if (iVar5 == 0) {
          gValScheme = Val_Never;
          bVar1 = gDiscardDefaultContent;
          bVar2 = gSplitCdataSections;
          bVar3 = gXMLDeclaration;
        }
        else {
          pcVar16 = "auto";
          iVar5 = strcmp(pcVar19,"auto");
          if (iVar5 == 0) {
            gValScheme = Val_Auto;
            bVar1 = gDiscardDefaultContent;
            bVar2 = gSplitCdataSections;
            bVar3 = gXMLDeclaration;
          }
          else {
            pcVar16 = "always";
            iVar5 = strcmp(pcVar19,"always");
            if (iVar5 != 0) {
              pcVar16 = "Unknown -v= value: ";
              goto LAB_00103e0c;
            }
            gValScheme = Val_Always;
            bVar1 = gDiscardDefaultContent;
            bVar2 = gSplitCdataSections;
            bVar3 = gXMLDeclaration;
          }
        }
      }
      else {
        bVar1 = gDiscardDefaultContent;
        bVar2 = gSplitCdataSections;
        bVar3 = gXMLDeclaration;
        if (((pcVar19[1] == 'n') && (pcVar19[2] == '\0')) ||
           ((pcVar19[1] == 'N' && (pcVar19[2] == '\0')))) {
          gDoNamespaces = 1;
        }
        else if (((pcVar19[1] == 's') && (pcVar19[2] == '\0')) ||
                ((pcVar19[1] == 'S' && (pcVar19[2] == '\0')))) {
          gDoSchema = 1;
        }
        else if (((pcVar19[1] == 'f') && (pcVar19[2] == '\0')) ||
                ((pcVar19[1] == 'F' && (pcVar19[2] == '\0')))) {
          gSchemaFullChecking = 1;
        }
        else if (((pcVar19[1] == 'e') && (pcVar19[2] == '\0')) ||
                ((pcVar19[1] == 'E' && (pcVar19[2] == '\0')))) {
          gDoCreate = (XercesDOMParser)0x1;
        }
        else {
          iVar5 = strncmp(pcVar19,"-wenc=",6);
          if (iVar5 == 0) {
            pcVar16 = (char *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
            gOutputEncoding =
                 (XMLCh *)xercesc_4_0::XMLString::transcode
                                    (pcVar19 + 6,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
            bVar1 = gDiscardDefaultContent;
            bVar2 = gSplitCdataSections;
            bVar3 = gXMLDeclaration;
          }
          else {
            pcVar16 = "-wfile=";
            iVar5 = strncmp(pcVar19,"-wfile=",7);
            if (iVar5 == 0) {
              goutputfile = pcVar19 + 7;
              bVar1 = gDiscardDefaultContent;
              bVar2 = gSplitCdataSections;
              bVar3 = gXMLDeclaration;
            }
            else {
              pcVar16 = "-wddc=";
              iVar5 = strncmp(pcVar19,"-wddc=",6);
              if (iVar5 == 0) {
                if (((pcVar19[6] == 'o') && (pcVar19[7] == 'n')) && (pcVar19[8] == '\0')) {
                  bVar1 = 0;
                  bVar2 = gSplitCdataSections;
                  bVar3 = gXMLDeclaration;
                }
                else {
                  pcVar19 = pcVar19 + 6;
                  pcVar16 = "off";
                  iVar5 = strcmp(pcVar19,"off");
                  bVar1 = 1;
                  bVar2 = gSplitCdataSections;
                  bVar3 = gXMLDeclaration;
                  if (iVar5 != 0) {
                    pcVar16 = "Unknown -wddc= value: ";
LAB_00103e0c:
                    poVar14 = std::operator<<((ostream *)&std::cerr,pcVar16);
                    poVar14 = std::operator<<(poVar14,pcVar19);
                    std::endl<char,std::char_traits<char>>(poVar14);
LAB_00103e24:
                    xercesc_4_0::XMLPlatformUtils::Terminate();
                    return 2;
                  }
                }
              }
              else {
                pcVar16 = "-wscs=";
                iVar5 = strncmp(pcVar19,"-wscs=",6);
                if (iVar5 == 0) {
                  if (((pcVar19[6] == 'o') && (pcVar19[7] == 'n')) && (pcVar19[8] == '\0')) {
                    bVar1 = gDiscardDefaultContent;
                    bVar2 = 0;
                    bVar3 = gXMLDeclaration;
                  }
                  else {
                    pcVar19 = pcVar19 + 6;
                    pcVar16 = "off";
                    iVar5 = strcmp(pcVar19,"off");
                    bVar1 = gDiscardDefaultContent;
                    bVar2 = 1;
                    bVar3 = gXMLDeclaration;
                    if (iVar5 != 0) {
                      pcVar16 = "Unknown -wscs= value: ";
                      goto LAB_00103e0c;
                    }
                  }
                }
                else {
                  pcVar16 = "-wflt=";
                  iVar5 = strncmp(pcVar19,"-wflt=",6);
                  if (iVar5 == 0) {
                    if (((pcVar19[6] == 'o') && (pcVar19[7] == 'n')) && (pcVar19[8] == '\0')) {
                      gUseFilter = 1;
                      bVar1 = gDiscardDefaultContent;
                      bVar2 = gSplitCdataSections;
                      bVar3 = gXMLDeclaration;
                    }
                    else {
                      pcVar19 = pcVar19 + 6;
                      pcVar16 = "off";
                      iVar5 = strcmp(pcVar19,"off");
                      if (iVar5 != 0) {
                        pcVar16 = "Unknown -wflt= value: ";
                        goto LAB_00103e0c;
                      }
                      gUseFilter = 0;
                      bVar1 = gDiscardDefaultContent;
                      bVar2 = gSplitCdataSections;
                      bVar3 = gXMLDeclaration;
                    }
                  }
                  else {
                    pcVar16 = "-wfpp=";
                    iVar5 = strncmp(pcVar19,"-wfpp=",6);
                    if (iVar5 == 0) {
                      if (((pcVar19[6] == 'o') && (pcVar19[7] == 'n')) && (pcVar19[8] == '\0')) {
                        gFormatPrettyPrint = 1;
                        bVar1 = gDiscardDefaultContent;
                        bVar2 = gSplitCdataSections;
                        bVar3 = gXMLDeclaration;
                      }
                      else {
                        pcVar19 = pcVar19 + 6;
                        pcVar16 = "off";
                        iVar5 = strcmp(pcVar19,"off");
                        if (iVar5 != 0) {
                          pcVar16 = "Unknown -wfpp= value: ";
                          goto LAB_00103e0c;
                        }
                        gFormatPrettyPrint = 0;
                        bVar1 = gDiscardDefaultContent;
                        bVar2 = gSplitCdataSections;
                        bVar3 = gXMLDeclaration;
                      }
                    }
                    else {
                      pcVar16 = "-wfdecl=";
                      iVar5 = strncmp(pcVar19,"-wfdecl=",8);
                      if (iVar5 == 0) {
                        if (((pcVar19[8] == 'o') && (pcVar19[9] == 'n')) && (pcVar19[10] == '\0')) {
                          bVar1 = gDiscardDefaultContent;
                          bVar2 = gSplitCdataSections;
                          bVar3 = 0;
                        }
                        else {
                          pcVar19 = pcVar19 + 8;
                          pcVar16 = "off";
                          iVar5 = strcmp(pcVar19,"off");
                          bVar1 = gDiscardDefaultContent;
                          bVar2 = gSplitCdataSections;
                          bVar3 = 1;
                          if (iVar5 != 0) {
                            pcVar16 = "Unknown -wfdecl= value: ";
                            goto LAB_00103e0c;
                          }
                        }
                      }
                      else {
                        pcVar16 = "-wbom=";
                        iVar5 = strncmp(pcVar19,"-wbom=",6);
                        if (iVar5 == 0) {
                          if (((pcVar19[6] == 'o') && (pcVar19[7] == 'n')) && (pcVar19[8] == '\0'))
                          {
                            gWriteBOM = 1;
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                          else {
                            pcVar19 = pcVar19 + 6;
                            pcVar16 = "off";
                            iVar5 = strcmp(pcVar19,"off");
                            if (iVar5 != 0) {
                              pcVar16 = "Unknown -wbom= value: ";
                              goto LAB_00103e0c;
                            }
                            gWriteBOM = 0;
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                        }
                        else {
                          pcVar16 = "-xpath=";
                          iVar5 = strncmp(pcVar19,"-xpath=",7);
                          if (iVar5 == 0) {
                            gXPathExpression = pcVar19 + 7;
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                          else {
                            poVar14 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
                            poVar14 = std::operator<<(poVar14,argV[uVar20]);
                            pcVar16 = "\', ignoring it.\n";
                            poVar14 = std::operator<<(poVar14,"\', ignoring it.\n");
                            std::endl<char,std::char_traits<char>>(poVar14);
                            bVar1 = gDiscardDefaultContent;
                            bVar2 = gSplitCdataSections;
                            bVar3 = gXMLDeclaration;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      gXMLDeclaration = bVar3;
      gSplitCdataSections = bVar2;
      gDiscardDefaultContent = bVar1;
    }
    if ((int)uVar21 + 1 == argC) {
      this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar16);
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this);
      bVar18 = SUB81(this,0);
      xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar18);
      xercesc_4_0::AbstractDOMParser::setDoSchema(bVar18);
      xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(bVar18);
      xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(bVar18);
      this[0x28] = gDoCreate;
      plVar6 = (long *)operator_new(0x10);
      *plVar6 = (long)&PTR__ErrorHandler_00107cf8;
      *(undefined1 *)(plVar6 + 1) = 0;
      xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this);
      xercesc_4_0::AbstractDOMParser::parse((char *)this);
      if ((char)plVar6[1] == '\0') {
        tempStr[2] = L'\0';
        tempStr[0] = L'L';
        tempStr[1] = L'S';
        plVar7 = (long *)xercesc_4_0::DOMImplementationRegistry::getDOMImplementation(tempStr);
        plVar8 = (long *)(**(code **)(*plVar7 + 0x18))
                                   (plVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        plVar7 = (long *)(**(code **)(*plVar7 + 0x28))
                                   (plVar7,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        (**(code **)(*plVar7 + 0x30))(plVar7,gOutputEncoding);
        if (gUseFilter == 1) {
          local_1058 = (DOMPrintFilter *)operator_new(0x10);
          DOMPrintFilter::DOMPrintFilter(local_1058,0x203);
          (**(code **)(*plVar8 + 0x20))(plVar8,local_1058);
        }
        else {
          local_1058 = (DOMPrintFilter *)0x0;
        }
        plVar9 = (long *)operator_new(8);
        *plVar9 = (long)&PTR__DOMErrorHandler_00107c38;
        plVar10 = (long *)(**(code **)(*plVar8 + 0x10))(plVar8);
        (**(code **)*plVar10)(plVar10,&xercesc_4_0::XMLUni::fgDOMErrorHandler,plVar9);
        cVar4 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                           gSplitCdataSections ^ 1);
        if (cVar4 != '\0') {
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTSplitCdataSections,
                     gSplitCdataSections ^ 1);
        }
        cVar4 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                           gDiscardDefaultContent ^ 1);
        if (cVar4 != '\0') {
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTDiscardDefaultContent,
                     gDiscardDefaultContent ^ 1);
        }
        cVar4 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,
                           gFormatPrettyPrint);
        if (cVar4 != '\0') {
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMWRTFormatPrettyPrint,gFormatPrettyPrint);
        }
        cVar4 = (**(code **)(*plVar10 + 0x20))(plVar10,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM);
        if (cVar4 != '\0') {
          (**(code **)(*plVar10 + 8))(plVar10,&xercesc_4_0::XMLUni::fgDOMWRTBOM,gWriteBOM);
        }
        puVar17 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
        cVar4 = (**(code **)(*plVar10 + 0x20))
                          (plVar10,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration ^ 1);
        if (cVar4 != '\0') {
          puVar17 = &xercesc_4_0::XMLUni::fgDOMXMLDeclaration;
          (**(code **)(*plVar10 + 8))
                    (plVar10,&xercesc_4_0::XMLUni::fgDOMXMLDeclaration,gXMLDeclaration ^ 1);
        }
        if (goutputfile == (char *)0x0) {
          local_1060 = (LocalFileFormatTarget *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x8,(ulong)puVar17);
          xercesc_4_0::StdOutFormatTarget::StdOutFormatTarget((StdOutFormatTarget *)local_1060);
        }
        else {
          local_1060 = (LocalFileFormatTarget *)
                       xercesc_4_0::XMemory::operator_new((XMemory *)0x30,(ulong)puVar17);
          xercesc_4_0::LocalFileFormatTarget::LocalFileFormatTarget
                    (local_1060,goutputfile,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        }
        (**(code **)(*plVar7 + 0x28))(plVar7,local_1060);
        plVar10 = (long *)xercesc_4_0::AbstractDOMParser::getDocument();
        if (gXPathExpression == (char *)0x0) {
          plVar12 = plVar10 + 3;
          if (plVar10 == (long *)0x0) {
            plVar12 = (long *)0x0;
          }
          (**(code **)(*plVar8 + 0x38))(plVar8,plVar12,plVar7);
        }
        else {
          xpathStr = (XMLCh *)xercesc_4_0::XMLString::transcode
                                        (gXPathExpression,
                                         xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          uVar11 = (**(code **)(*plVar10 + 0x68))(plVar10);
          plVar12 = plVar10 + 1;
          plVar10 = (long *)(**(code **)(plVar10[1] + 0x18))(plVar12,uVar11);
          plVar12 = (long *)(**(code **)(*plVar12 + 0x20))(plVar12,xpathStr,uVar11,plVar10,7,0);
          lVar13 = (**(code **)(*plVar12 + 0x68))(plVar12);
          for (lVar15 = 0; lVar13 != lVar15; lVar15 = lVar15 + 1) {
            (**(code **)(*plVar12 + 0x60))(plVar12,lVar15);
            uVar11 = (**(code **)(*plVar12 + 0x48))(plVar12);
            (**(code **)(*plVar8 + 0x38))(plVar8,uVar11,plVar7);
          }
          (**(code **)(*plVar12 + 0x70))(plVar12);
          (**(code **)(*plVar10 + 0x28))(plVar10);
          xercesc_4_0::XMLString::release(&xpathStr,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        }
        iVar5 = 0;
        (**(code **)(*plVar7 + 0x40))(plVar7);
        (**(code **)(*plVar8 + 0x50))(plVar8);
        (**(code **)(*(long *)local_1060 + 8))();
        (**(code **)(*plVar9 + 8))();
        if ((local_1058 != (DOMPrintFilter *)0x0) && ((gUseFilter & 1) != 0)) {
          (*(local_1058->super_DOMLSSerializerFilter).super_DOMNodeFilter._vptr_DOMNodeFilter[1])();
        }
      }
      else {
        iVar5 = 4;
      }
      (**(code **)(*plVar6 + 8))();
      (**(code **)(*(long *)this + 8))(this);
      xercesc_4_0::XMLString::release
                (&gOutputEncoding,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      xercesc_4_0::XMLPlatformUtils::Terminate();
      return iVar5;
    }
  }
  usage();
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return 1;
}

Assistant:

int main(int argC, char* argV[])
{
    int retval = 0;

    // Initialize the XML4C2 system
    try
    {
        XMLPlatformUtils::Initialize();
    }

    catch(const XMLException &toCatch)
    {
        std::cerr << "Error during Xerces-c Initialization.\n"
             << "  Exception message:"
             << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }

    // See if non validating dom parser configuration is requested.
    int parmInd;
    for (parmInd = 1; parmInd < argC; parmInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[parmInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[parmInd], "-?"))
        {
            usage();
            XMLPlatformUtils::Terminate();
            return 2;
        }
         else if (!strncmp(argV[parmInd], "-v=", 3)
              ||  !strncmp(argV[parmInd], "-V=", 3))
        {
            const char* const parm = &argV[parmInd][3];

            if (!strcmp(parm, "never"))
                gValScheme = XercesDOMParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                gValScheme = XercesDOMParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                gValScheme = XercesDOMParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strcmp(argV[parmInd], "-n")
              ||  !strcmp(argV[parmInd], "-N"))
        {
            gDoNamespaces = true;
        }
         else if (!strcmp(argV[parmInd], "-s")
              ||  !strcmp(argV[parmInd], "-S"))
        {
            gDoSchema = true;
        }
         else if (!strcmp(argV[parmInd], "-f")
              ||  !strcmp(argV[parmInd], "-F"))
        {
            gSchemaFullChecking = true;
        }
         else if (!strcmp(argV[parmInd], "-e")
              ||  !strcmp(argV[parmInd], "-E"))
        {
            gDoCreate = true;
        }
         else if (!strncmp(argV[parmInd], "-wenc=", 6))
        {
             // Get out the encoding name
             gOutputEncoding = XMLString::transcode( &(argV[parmInd][6]) );
        }
         else if (!strncmp(argV[parmInd], "-wfile=", 7))
        {
             goutputfile =  &(argV[parmInd][7]);
        }
         else if (!strncmp(argV[parmInd], "-wddc=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gDiscardDefaultContent = true;
            else if (!strcmp(parm, "off"))
				gDiscardDefaultContent = false;
            else
            {
                std::cerr << "Unknown -wddc= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }

        }
         else if (!strncmp(argV[parmInd], "-wscs=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gSplitCdataSections = true;
			else if (!strcmp(parm, "off"))
				gSplitCdataSections = false;
            else
            {
                std::cerr << "Unknown -wscs= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wflt=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gUseFilter = true;
			else if (!strcmp(parm, "off"))
				gUseFilter = false;
            else
            {
                std::cerr << "Unknown -wflt= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfpp=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
				gFormatPrettyPrint = true;
			else if (!strcmp(parm, "off"))
				gFormatPrettyPrint = false;
            else
            {
                std::cerr << "Unknown -wfpp= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-wfdecl=", 8))
        {
             const char* const parm = &argV[parmInd][8];

             if (!strcmp(parm, "on"))
                 gXMLDeclaration = true;
             else if (!strcmp(parm, "off"))
                 gXMLDeclaration = false;
             else
             {
                 std::cerr << "Unknown -wfdecl= value: " << parm << std::endl;
                 XMLPlatformUtils::Terminate();
                 return 2;
             }
        }
         else if (!strncmp(argV[parmInd], "-wbom=", 6))
        {
            const char* const parm = &argV[parmInd][6];

            if (!strcmp(parm, "on"))
                gWriteBOM = true;
            else if (!strcmp(parm, "off"))
                gWriteBOM = false;
            else
            {
                std::cerr << "Unknown -wbom= value: " << parm << std::endl;
                XMLPlatformUtils::Terminate();
                return 2;
            }
        }
         else if (!strncmp(argV[parmInd], "-xpath=", 7))
        {
             gXPathExpression = &(argV[parmInd][7]);
        }
         else
        {
            std::cerr << "Unknown option '" << argV[parmInd]
                 << "', ignoring it.\n" << std::endl;
        }
    }

    //
    //  And now we have to have only one parameter left and it must be
    //  the file name.
    //
    if (parmInd + 1 != argC)
    {
        usage();
        XMLPlatformUtils::Terminate();
        return 1;
    }
    gXmlFile = argV[parmInd];

    //
    //  Create our parser, then attach an error handler to the parser.
    //  The parser will call back to methods of the ErrorHandler if it
    //  discovers errors during the course of parsing the XML document.
    //
    XercesDOMParser *parser = new XercesDOMParser;
    parser->setValidationScheme(gValScheme);
    parser->setDoNamespaces(gDoNamespaces);
    parser->setDoSchema(gDoSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(gSchemaFullChecking);
    parser->setCreateEntityReferenceNodes(gDoCreate);

    DOMTreeErrorReporter *errReporter = new DOMTreeErrorReporter();
    parser->setErrorHandler(errReporter);

    //
    //  Parse the XML file, catching any XML exceptions that might propogate
    //  out of it.
    //
    bool errorsOccured = false;
    try
    {
        parser->parse(gXmlFile);
    }
    catch (const OutOfMemoryException&)
    {
        std::cerr << "OutOfMemoryException" << std::endl;
        errorsOccured = true;
    }
    catch (const XMLException& e)
    {
        std::cerr << "An error occurred during parsing\n   Message: "
             << StrX(e.getMessage()) << std::endl;
        errorsOccured = true;
    }

    catch (const DOMException& e)
    {
        const unsigned int maxChars = 2047;
        XMLCh errText[maxChars + 1];

        std::cerr << "\nDOM Error during parsing: '" << gXmlFile << "'\n"
             << "DOMException code is:  " << e.code << std::endl;

        if (DOMImplementation::loadDOMExceptionMsg(e.code, errText, maxChars))
             std::cerr << "Message is: " << StrX(errText) << std::endl;

        errorsOccured = true;
    }

    catch (...)
    {
        std::cerr << "An error occurred during parsing\n " << std::endl;
        errorsOccured = true;
    }

    // If the parse was successful, output the document data from the DOM tree
    if (!errorsOccured && !errReporter->getSawErrors())
    {
        DOMPrintFilter   *myFilter = 0;

        try
        {
            // get a serializer, an instance of DOMLSSerializer
            XMLCh tempStr[3] = {chLatin_L, chLatin_S, chNull};
            DOMImplementation *impl          = DOMImplementationRegistry::getDOMImplementation(tempStr);
            DOMLSSerializer   *theSerializer = ((DOMImplementationLS*)impl)->createLSSerializer();
            DOMLSOutput       *theOutputDesc = ((DOMImplementationLS*)impl)->createLSOutput();

            // set user specified output encoding
            theOutputDesc->setEncoding(gOutputEncoding);

            // plug in user's own filter
            if (gUseFilter)
            {
                // even we say to show attribute, but the DOMLSSerializer
                // will not show attribute nodes to the filter as
                // the specs explicitly says that DOMLSSerializer shall
                // NOT show attributes to DOMLSSerializerFilter.
                //
                // so DOMNodeFilter::SHOW_ATTRIBUTE has no effect.
                // same DOMNodeFilter::SHOW_DOCUMENT_TYPE, no effect.
                //
                myFilter = new DOMPrintFilter(DOMNodeFilter::SHOW_ELEMENT   |
                                              DOMNodeFilter::SHOW_ATTRIBUTE |
                                              DOMNodeFilter::SHOW_DOCUMENT_TYPE);
                theSerializer->setFilter(myFilter);
            }

            // plug in user's own error handler
            DOMErrorHandler *myErrorHandler = new DOMPrintErrorHandler();
            DOMConfiguration* serializerConfig=theSerializer->getDomConfig();
            serializerConfig->setParameter(XMLUni::fgDOMErrorHandler, myErrorHandler);

            // set feature if the serializer supports the feature/mode
            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections))
                serializerConfig->setParameter(XMLUni::fgDOMWRTSplitCdataSections, gSplitCdataSections);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent))
                serializerConfig->setParameter(XMLUni::fgDOMWRTDiscardDefaultContent, gDiscardDefaultContent);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint))
                serializerConfig->setParameter(XMLUni::fgDOMWRTFormatPrettyPrint, gFormatPrettyPrint);

            if (serializerConfig->canSetParameter(XMLUni::fgDOMWRTBOM, gWriteBOM))
                serializerConfig->setParameter(XMLUni::fgDOMWRTBOM, gWriteBOM);
            
            if (serializerConfig->canSetParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration))
                serializerConfig->setParameter(XMLUni::fgDOMXMLDeclaration, gXMLDeclaration);

            //
            // Plug in a format target to receive the resultant
            // XML stream from the serializer.
            //
            // StdOutFormatTarget prints the resultant XML stream
            // to stdout once it receives any thing from the serializer.
            //
            XMLFormatTarget *myFormTarget;
            if (goutputfile)
                myFormTarget=new LocalFileFormatTarget(goutputfile);
            else
                myFormTarget=new StdOutFormatTarget();
            theOutputDesc->setByteStream(myFormTarget);

            // get the DOM representation
            DOMDocument *doc = parser->getDocument();

            //
            // do the serialization through DOMLSSerializer::write();
            //
            if(gXPathExpression!=NULL)
            {
                XMLCh* xpathStr=XMLString::transcode(gXPathExpression);
                DOMElement* root = doc->getDocumentElement();
                try
                {
                    DOMXPathNSResolver* resolver=doc->createNSResolver(root);
                    DOMXPathResult* result=doc->evaluate(
                      xpathStr,
                      root,
                      resolver,
                      DOMXPathResult::ORDERED_NODE_SNAPSHOT_TYPE,
                      NULL);

                    XMLSize_t nLength = result->getSnapshotLength();
                    for(XMLSize_t i = 0; i < nLength; i++)
                    {
                      result->snapshotItem(i);
                      theSerializer->write(result->getNodeValue(), theOutputDesc);
                    }

                    result->release();
                    resolver->release ();
                }
                catch(const DOMXPathException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                catch(const DOMException& e)
                {
                    std::cerr << "An error occurred during processing of the XPath expression. Msg is:"
                        << std::endl
                        << StrX(e.getMessage()) << std::endl;
                    retval = 4;
                }
                XMLString::release(&xpathStr);
            }
            else
                theSerializer->write(doc, theOutputDesc);

            theOutputDesc->release();
            theSerializer->release();

            //
            // Filter, formatTarget and error handler
            // are NOT owned by the serializer.
            //
            delete myFormTarget;
            delete myErrorHandler;

            if (gUseFilter)
                delete myFilter;

        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            retval = 5;
        }
        catch (const DOMLSException& e)
        {
            std::cerr << "An error occurred during serialization of the DOM tree. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }
        catch (const XMLException& e)
        {
            std::cerr << "An error occurred during creation of output transcoder. Msg is:"
                << std::endl
                << StrX(e.getMessage()) << std::endl;
            retval = 4;
        }

    }
    else
        retval = 4;

    //
    //  Clean up the error handler. The parser does not adopt handlers
    //  since they could be many objects or one object installed for multiple
    //  handlers.
    //
    delete errReporter;

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    XMLString::release(&gOutputEncoding);

    // And call the termination method
    XMLPlatformUtils::Terminate();

    return retval;
}